

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallCommand.cxx
# Opt level: O0

string * __thiscall
(anonymous_namespace)::Helper::GetCxxModulesBmiDestination_abi_cxx11_
          (string *__return_storage_ptr__,void *this,cmInstallCommandArguments *args)

{
  string *psVar1;
  cmInstallCommandArguments *args_local;
  Helper *this_local;
  
  if (args == (cmInstallCommandArguments *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    psVar1 = cmInstallCommandArguments::GetDestination_abi_cxx11_(args);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Helper::GetCxxModulesBmiDestination(
  const cmInstallCommandArguments* args) const
{
  if (args) {
    return args->GetDestination();
  }
  return {};
}